

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O1

Ivy_Obj_t * Ivy_ObjCreate(Ivy_Man_t *p,Ivy_Obj_t *pGhost)

{
  uint *puVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  Ivy_Obj_t *pIVar7;
  void **ppvVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Vec_Ptr_t *pVVar16;
  
  if (((ulong)pGhost & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x50,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (-1 < pGhost->Id) {
    __assert_fail("Ivy_ObjIsGhost(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x51,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  pIVar7 = Ivy_TableLookup(p,pGhost);
  if (pIVar7 != (Ivy_Obj_t *)0x0) {
    __assert_fail("Ivy_TableLookup(p, pGhost) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x52,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (p->pListFree == (Ivy_Obj_t *)0x0) {
    Ivy_ManAddMemory(p);
  }
  pIVar7 = p->pListFree;
  p->pListFree = *(Ivy_Obj_t **)pIVar7;
  pIVar7->Id = 0;
  pIVar7->TravId = 0;
  *(undefined8 *)&pIVar7->field_0x8 = 0;
  pIVar7->pPrevFan1 = (Ivy_Obj_t *)0x0;
  pIVar7->pEquiv = (Ivy_Obj_t *)0x0;
  pIVar7->pNextFan1 = (Ivy_Obj_t *)0x0;
  pIVar7->pPrevFan0 = (Ivy_Obj_t *)0x0;
  pIVar7->pFanout = (Ivy_Obj_t *)0x0;
  pIVar7->pNextFan0 = (Ivy_Obj_t *)0x0;
  pIVar7->pFanin0 = (Ivy_Obj_t *)0x0;
  pIVar7->pFanin1 = (Ivy_Obj_t *)0x0;
  if ((pIVar7->field_0x8 & 0xf) != 0) {
    __assert_fail("Ivy_ObjIsNone(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                  ,0x55,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  pVVar16 = p->vObjs;
  uVar6 = pVVar16->nSize;
  pIVar7->Id = uVar6;
  uVar5 = pVVar16->nCap;
  if (uVar6 == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (pVVar16->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar16->pArray,0x80);
      }
      pVVar16->pArray = ppvVar8;
      iVar14 = 0x10;
    }
    else {
      iVar14 = uVar5 * 2;
      if (iVar14 <= (int)uVar5) goto LAB_00759372;
      if (pVVar16->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar16->pArray,(ulong)uVar5 << 4);
      }
      pVVar16->pArray = ppvVar8;
    }
    pVVar16->nCap = iVar14;
  }
LAB_00759372:
  iVar14 = pVVar16->nSize;
  pVVar16->nSize = iVar14 + 1;
  pVVar16->pArray[iVar14] = pIVar7;
  uVar5 = *(uint *)&pGhost->field_0x8 & 0xf;
  uVar6 = *(uint *)&pIVar7->field_0x8;
  *(uint *)&pIVar7->field_0x8 = uVar6 & 0xfffffff0 | uVar5;
  *(uint *)&pIVar7->field_0x8 = uVar6 & 0xfffff9f0 | uVar5 | *(uint *)&pGhost->field_0x8 & 0x600;
  Ivy_ObjConnect(p,pIVar7,pGhost->pFanin0,pGhost->pFanin1);
  uVar6 = *(uint *)&pIVar7->field_0x8;
  uVar5 = uVar6 & 0xf;
  if (uVar5 - 7 < 0xfffffffe) {
    if (uVar5 == 4) {
      uVar6 = uVar6 & 0x7f4;
      goto LAB_00759459;
    }
    if (((uVar5 < 8) && ((0x8cU >> uVar5 & 1) != 0)) || (uVar5 == 4)) {
      uVar6 = uVar6 & 0x7ff |
              *(uint *)(((ulong)pIVar7->pFanin0 & 0xfffffffffffffffe) + 8) & 0xfffff800;
      goto LAB_00759459;
    }
    if (uVar5 != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyObj.c"
                    ,0x65,"Ivy_Obj_t *Ivy_ObjCreate(Ivy_Man_t *, Ivy_Obj_t *)");
    }
  }
  else {
    uVar11 = (ulong)pIVar7->pFanin0 & 0xfffffffffffffffe;
    uVar12 = (ulong)pIVar7->pFanin1 & 0xfffffffffffffffe;
    if (*(uint *)(uVar12 + 8) >> 0xb < *(uint *)(uVar11 + 8) >> 0xb) {
      uVar12 = uVar11;
    }
    uVar6 = uVar6 & 0x7ff | *(int *)(uVar12 + 8) + (uint)(uVar5 == 6) * 0x800 + 0x800 & 0xfffff800;
LAB_00759459:
    *(uint *)&pIVar7->field_0x8 = uVar6;
  }
  uVar6 = *(uint *)&pIVar7->field_0x8 & 0xf;
  if (uVar6 - 7 < 0xfffffffe) {
    if ((uVar6 < 8) && ((0x9cU >> uVar6 & 1) != 0)) {
      pIVar3 = pIVar7->pFanin0;
      if (((ulong)pIVar3 & 1) == 0) {
        uVar6 = *(uint *)&pIVar3->field_0x8 & 0x80;
      }
      else {
        uVar6 = ~*(uint *)(((ulong)pIVar3 & 0xfffffffffffffffe) + 8) & 0x80;
      }
      goto LAB_007594ec;
    }
  }
  else {
    pIVar3 = pIVar7->pFanin0;
    if (((ulong)pIVar3 & 1) == 0) {
      uVar6 = *(uint *)&pIVar3->field_0x8;
    }
    else {
      uVar6 = ~*(uint *)(((ulong)pIVar3 & 0xfffffffffffffffe) + 8);
    }
    pIVar3 = pIVar7->pFanin1;
    if (((ulong)pIVar3 & 1) == 0) {
      uVar5 = *(uint *)&pIVar3->field_0x8;
    }
    else {
      uVar5 = ~*(uint *)(((ulong)pIVar3 & 0xfffffffffffffffe) + 8);
    }
    uVar6 = uVar5 & 0x80 & uVar6 & 0x80;
LAB_007594ec:
    *(uint *)&pIVar7->field_0x8 = *(uint *)&pIVar7->field_0x8 & 0xffffff7f | uVar6;
  }
  if (0xfffffffd < (*(uint *)&pIVar7->field_0x8 & 0xf) - 7) {
    *(uint *)&pIVar7->field_0x8 =
         *(uint *)&pIVar7->field_0x8 & 0xfffffeff |
         (*(uint *)(((ulong)pIVar7->pFanin1 & 0xfffffffffffffffe) + 8) |
         *(uint *)(((ulong)pIVar7->pFanin0 & 0xfffffffffffffffe) + 8)) & 0x100;
  }
  if ((*(uint *)&pIVar7->field_0x8 & 0xf) == 6) {
    puVar1 = (uint *)(((ulong)pIVar7->pFanin0 & 0xfffffffffffffffe) + 8);
    *puVar1 = *puVar1 | 0x40;
    puVar1 = (uint *)(((ulong)pIVar7->pFanin1 & 0xfffffffffffffffe) + 8);
    *puVar1 = *puVar1 | 0x40;
  }
  uVar6 = *(uint *)&pIVar7->field_0x8 & 0xf;
  if (uVar6 == 2) {
    pVVar16 = p->vPos;
LAB_00759571:
    uVar6 = pVVar16->nCap;
    if (pVVar16->nSize == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (pVVar16->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(pVVar16->pArray,0x80);
        }
        pVVar16->pArray = ppvVar8;
        iVar14 = 0x10;
      }
      else {
        iVar14 = uVar6 * 2;
        if (iVar14 <= (int)uVar6) goto LAB_00759611;
        if (pVVar16->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc((ulong)uVar6 << 4);
        }
        else {
          ppvVar8 = (void **)realloc(pVVar16->pArray,(ulong)uVar6 << 4);
        }
        pVVar16->pArray = ppvVar8;
      }
      pVVar16->nCap = iVar14;
    }
LAB_00759611:
    iVar14 = pVVar16->nSize;
    pVVar16->nSize = iVar14 + 1;
    pVVar16->pArray[iVar14] = pIVar7;
  }
  else if (uVar6 == 1) {
    pVVar16 = p->vPis;
    goto LAB_00759571;
  }
  pVVar4 = p->vRequired;
  if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_007596ed;
  iVar14 = pVVar4->nSize;
  if (pIVar7->Id < iVar14) goto LAB_007596ed;
  iVar13 = iVar14 * 2;
  if (iVar13 <= iVar14) goto LAB_007596ed;
  iVar2 = pVVar4->nCap;
  iVar15 = iVar2 * 2;
  if (iVar15 < iVar13) {
    if (iVar2 < iVar13) {
      if (pVVar4->pArray == (int *)0x0) {
        piVar9 = (int *)malloc((long)iVar14 << 3);
      }
      else {
        piVar9 = (int *)realloc(pVVar4->pArray,(long)iVar14 << 3);
      }
      pVVar4->pArray = piVar9;
      iVar15 = iVar13;
LAB_007596be:
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = iVar15;
    }
  }
  else if (iVar2 < iVar15 && iVar2 < iVar13) {
    if (pVVar4->pArray == (int *)0x0) {
      piVar9 = (int *)malloc((long)iVar2 << 3);
    }
    else {
      piVar9 = (int *)realloc(pVVar4->pArray,(long)iVar2 << 3);
    }
    pVVar4->pArray = piVar9;
    goto LAB_007596be;
  }
  lVar10 = (long)pVVar4->nSize;
  if (pVVar4->nSize < iVar13) {
    piVar9 = pVVar4->pArray;
    do {
      piVar9[lVar10] = 1000000;
      lVar10 = lVar10 + 1;
    } while (iVar13 != lVar10);
  }
  pVVar4->nSize = iVar13;
LAB_007596ed:
  p->nObjs[*(uint *)&pIVar7->field_0x8 & 0xf] = p->nObjs[*(uint *)&pIVar7->field_0x8 & 0xf] + 1;
  p->nCreated = p->nCreated + 1;
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    Ivy_ManHaigCreateObj(p,pIVar7);
  }
  return pIVar7;
}

Assistant:

Ivy_Obj_t * Ivy_ObjCreate( Ivy_Man_t * p, Ivy_Obj_t * pGhost )
{
    Ivy_Obj_t * pObj;
    assert( !Ivy_IsComplement(pGhost) );
    assert( Ivy_ObjIsGhost(pGhost) );
    assert( Ivy_TableLookup(p, pGhost) == NULL );
    // get memory for the new object
    pObj = Ivy_ManFetchMemory( p );
    assert( Ivy_ObjIsNone(pObj) );
    pObj->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pObj );
    // add basic info (fanins, compls, type, init)
    pObj->Type = pGhost->Type;
    pObj->Init = pGhost->Init;
    // add connections
    Ivy_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // compute level
    if ( Ivy_ObjIsNode(pObj) )
        pObj->Level = Ivy_ObjLevelNew(pObj);
    else if ( Ivy_ObjIsLatch(pObj) )
        pObj->Level = 0;
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->Level = Ivy_ObjFanin0(pObj)->Level;
    else if ( !Ivy_ObjIsPi(pObj) )
        assert( 0 );
    // create phase
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) & Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj));
    else if ( Ivy_ObjIsOneFanin(pObj) )
        pObj->fPhase = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj));
    // set the fail TFO flag
    if ( Ivy_ObjIsNode(pObj) )
        pObj->fFailTfo = Ivy_ObjFanin0(pObj)->fFailTfo | Ivy_ObjFanin1(pObj)->fFailTfo;
    // mark the fanins in a special way if the node is EXOR
    if ( Ivy_ObjIsExor(pObj) )
    {
        Ivy_ObjFanin0(pObj)->fExFan = 1;
        Ivy_ObjFanin1(pObj)->fExFan = 1;
    }
    // add PIs/POs to the arrays
    if ( Ivy_ObjIsPi(pObj) )
        Vec_PtrPush( p->vPis, pObj );
    else if ( Ivy_ObjIsPo(pObj) )
        Vec_PtrPush( p->vPos, pObj );
//    else if ( Ivy_ObjIsBuf(pObj) )
//        Vec_PtrPush( p->vBufs, pObj );
    if ( p->vRequired && Vec_IntSize(p->vRequired) <= pObj->Id )
        Vec_IntFillExtra( p->vRequired, 2 * Vec_IntSize(p->vRequired), 1000000 );
    // update node counters of the manager
    p->nObjs[Ivy_ObjType(pObj)]++;
    p->nCreated++;

//    printf( "Adding %sAIG node: ", p->pHaig==NULL? "H":" " );
//    Ivy_ObjPrintVerbose( p, pObj, p->pHaig==NULL );
//    printf( "\n" );

    // if HAIG is defined, create a corresponding node
    if ( p->pHaig )
        Ivy_ManHaigCreateObj( p, pObj );
    return pObj;
}